

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O3

uint __thiscall
JsUtil::anon_unknown_5::ImplicitKeyValueEntry<unsigned_int,_Value_*>::Key
          (ImplicitKeyValueEntry<unsigned_int,_Value_*> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  
  pVVar4 = (this->super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>
           ).super_ValueEntryData<Value_*>.value;
  if (pVVar4 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                       ,0x13b,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pVVar4 = (this->
             super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>).
             super_ValueEntryData<Value_*>.value;
  }
  return pVVar4->valueNumber;
}

Assistant:

TKey Key() const { return ValueToKey<TKey, TValue>::ToKey(this->value); }